

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::learn_empty_clause(Internal *this)

{
  iterator __position;
  pointer puVar1;
  uint64_t id;
  uint64_t local_18;
  
  build_chain_for_empty(this);
  if (this->external->solution != (char *)0x0) {
    External::check_no_solution_after_learning_empty_clause(this->external);
  }
  id = this->clause_id + 1;
  this->clause_id = id;
  if (this->proof != (Proof *)0x0) {
    Proof::add_derived_empty_clause(this->proof,id,&this->lrat_chain);
  }
  this->unsat = true;
  this->conflict_id = id;
  this->marked_failed = true;
  __position._M_current =
       (this->conclusion).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->conclusion).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = id;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->conclusion,__position,&local_18);
  }
  else {
    *__position._M_current = id;
    (this->conclusion).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  puVar1 = (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void Internal::learn_empty_clause () {
  assert (!unsat);
  build_chain_for_empty ();
  LOG ("learned empty clause");
  external->check_learned_empty_clause ();
  int64_t id = ++clause_id;
  if (proof) {
    proof->add_derived_empty_clause (id, lrat_chain);
  }
  unsat = true;
  conflict_id = id;
  marked_failed = true;
  conclusion.push_back (id);
  lrat_chain.clear ();
}